

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

Value * value_new(ValueType vt)

{
  char *__s;
  size_t sVar1;
  Value *e;
  Value *pVVar2;
  
  value_new::next_index = value_new::next_index + 1;
  __s = dupprintf("%s%lu",type_names[vt]);
  sVar1 = strlen(__s);
  e = (Value *)safemalloc(1,0x20,sVar1 + 1);
  memcpy(e + 1,__s,sVar1 + 1);
  (e->id).ptr = e + 1;
  (e->id).len = sVar1;
  e->type = vt;
  pVVar2 = (Value *)add234(values,e);
  if (pVVar2 == e) {
    safefree(__s);
    return e;
  }
  __assert_fail("added == val",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testcrypt.c"
                ,0xb3,"Value *value_new(ValueType)");
}

Assistant:

static Value *value_new(ValueType vt)
{
    static uint64_t next_index = 0;

    char *name = dupprintf("%s%"PRIu64, type_names[vt], next_index++);
    size_t namelen = strlen(name);

    Value *val = snew_plus(Value, namelen+1);
    memcpy(snew_plus_get_aux(val), name, namelen+1);
    val->id.ptr = snew_plus_get_aux(val);
    val->id.len = namelen;
    val->type = vt;

    Value *added = add234(values, val);
    assert(added == val);

    sfree(name);

    return val;
}